

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pbrt::RGBUnboundedSpectrum,pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>>::
vector<pbrt::RGBUnboundedSpectrum_const*>
          (vector<pbrt::RGBUnboundedSpectrum,pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>>
           *this,RGBUnboundedSpectrum *first,RGBUnboundedSpectrum *last,
          polymorphic_allocator<pbrt::RGBUnboundedSpectrum> *alloc)

{
  RGBUnboundedSpectrum *pRVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  
  *(memory_resource **)this = alloc->memoryResource;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
  ::reserve((vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
             *)this,(long)last - (long)first >> 4);
  for (lVar4 = 0; pRVar1 = (RGBUnboundedSpectrum *)((long)&first->scale + lVar4), pRVar1 != last;
      lVar4 = lVar4 + 0x10) {
    uVar3 = *(undefined8 *)&(pRVar1->rsp).c1;
    lVar2 = *(long *)(this + 8);
    *(undefined8 *)(lVar2 + lVar4) = *(undefined8 *)pRVar1;
    ((undefined8 *)(lVar2 + lVar4))[1] = uVar3;
  }
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }